

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall
TLeonardoHeap<smoothsort_ptr<double>_>::TLeonardoHeap
          (TLeonardoHeap<smoothsort_ptr<double>_> *this,smoothsort_ptr<double> *_data,size_t _N)

{
  bool bVar1;
  ulong local_28;
  size_t i;
  size_t _N_local;
  smoothsort_ptr<double> *_data_local;
  TLeonardoHeap<smoothsort_ptr<double>_> *this_local;
  
  this->data = _data;
  this->N = _N;
  this->tree_vector = 3;
  this->first_tree = 0;
  if ((1 < this->N) && (bVar1 = smoothsort_ptr<double>::operator>(this->data,this->data + 1), bVar1)
     ) {
    swap(this,0,1);
  }
  for (local_28 = 2; local_28 < this->N; local_28 = local_28 + 1) {
    insertion_sort(this,local_28);
  }
  return;
}

Assistant:

TLeonardoHeap<T>::TLeonardoHeap(T* _data, size_t _N) : data(_data) , N(_N) {
	// Initialize the heap with the first two elements
	tree_vector = 3;
	first_tree = 0;
	if(N > 1) { if(data[0] > data[1]) { swap(0, 1); } }
	// Insert each element sequentially
	for(size_t i=2; i<N; i++) { insertion_sort(i); }
}